

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_volumemeter.c
# Opt level: O3

void FAudioFXVolumeMeter_GetParameters
               (FAudioFXVolumeMeter *fapo,FAudioFXVolumeMeterLevels *pParameters,
               uint32_t ParameterByteSize)

{
  uint8_t *puVar1;
  
  puVar1 = (fapo->base).m_pCurrentParameters;
  if (pParameters->pPeakLevels != (float *)0x0) {
    SDL_memcpy(pParameters->pPeakLevels,*(undefined8 *)puVar1,(ulong)fapo->channels << 2);
  }
  if (pParameters->pRMSLevels != (float *)0x0) {
    SDL_memcpy(pParameters->pRMSLevels,*(undefined8 *)(puVar1 + 8),(ulong)fapo->channels << 2);
    return;
  }
  return;
}

Assistant:

void FAudioFXVolumeMeter_GetParameters(
	FAudioFXVolumeMeter *fapo,
	FAudioFXVolumeMeterLevels *pParameters,
	uint32_t ParameterByteSize
) {
	FAudioFXVolumeMeterLevels *levels = (FAudioFXVolumeMeterLevels*)
		fapo->base.m_pCurrentParameters;
	FAudio_assert(ParameterByteSize == sizeof(FAudioFXVolumeMeterLevels));
	FAudio_assert(pParameters->ChannelCount == fapo->channels);

	/* Copy what's current as of the last Process */
	if (pParameters->pPeakLevels != NULL)
	{
		FAudio_memcpy(
			pParameters->pPeakLevels,
			levels->pPeakLevels,
			fapo->channels * sizeof(float)
		);
	}
	if (pParameters->pRMSLevels != NULL)
	{
		FAudio_memcpy(
			pParameters->pRMSLevels,
			levels->pRMSLevels,
			fapo->channels * sizeof(float)
		);
	}
}